

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  size_t sVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  ucvector header;
  ucvector local_58;
  uint local_34;
  
  local_58.data = (uchar *)0x0;
  local_58.size = 0;
  local_58.allocsize = 0;
  local_34 = interlace_method;
  lodepng_add32bitInt(&local_58,w);
  lodepng_add32bitInt(&local_58,h);
  sVar1 = local_58.size;
  uVar4 = local_58.size + 1;
  puVar3 = local_58.data;
  uVar5 = local_58.allocsize;
  if (local_58.allocsize < uVar4) {
    uVar5 = uVar4 * 3 >> 1;
    if (local_58.allocsize * 2 < uVar4) {
      uVar5 = uVar4;
    }
    puVar3 = (uchar *)realloc(local_58.data,uVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_0010dc00;
  }
  else {
LAB_0010dc00:
    local_58.allocsize = uVar5;
    local_58.data = puVar3;
    local_58.data[sVar1] = (uchar)bitdepth;
    local_58.size = uVar4;
  }
  sVar1 = local_58.size;
  uVar4 = local_58.size + 1;
  puVar3 = local_58.data;
  uVar5 = local_58.allocsize;
  if (local_58.allocsize < uVar4) {
    uVar5 = uVar4 * 3 >> 1;
    if (local_58.allocsize * 2 < uVar4) {
      uVar5 = uVar4;
    }
    puVar3 = (uchar *)realloc(local_58.data,uVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_0010dc4b;
  }
  else {
LAB_0010dc4b:
    local_58.allocsize = uVar5;
    local_58.data = puVar3;
    local_58.data[sVar1] = (uchar)colortype;
    local_58.size = uVar4;
  }
  sVar1 = local_58.size;
  uVar4 = local_58.size + 1;
  puVar3 = local_58.data;
  uVar5 = local_58.allocsize;
  if (local_58.allocsize < uVar4) {
    uVar5 = uVar4 * 3 >> 1;
    if (local_58.allocsize * 2 < uVar4) {
      uVar5 = uVar4;
    }
    puVar3 = (uchar *)realloc(local_58.data,uVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_0010dc96;
  }
  else {
LAB_0010dc96:
    local_58.allocsize = uVar5;
    local_58.data = puVar3;
    local_58.data[sVar1] = '\0';
    local_58.size = uVar4;
  }
  sVar1 = local_58.size;
  uVar4 = local_58.size + 1;
  puVar3 = local_58.data;
  uVar5 = local_58.allocsize;
  if (local_58.allocsize < uVar4) {
    uVar5 = uVar4 * 3 >> 1;
    if (local_58.allocsize * 2 < uVar4) {
      uVar5 = uVar4;
    }
    puVar3 = (uchar *)realloc(local_58.data,uVar5);
    if (puVar3 != (uchar *)0x0) goto LAB_0010dce2;
  }
  else {
LAB_0010dce2:
    local_58.allocsize = uVar5;
    local_58.data = puVar3;
    local_58.data[sVar1] = '\0';
    local_58.size = uVar4;
  }
  sVar1 = local_58.size;
  uVar4 = local_58.size + 1;
  puVar3 = local_58.data;
  uVar5 = local_58.allocsize;
  if (local_58.allocsize < uVar4) {
    uVar5 = uVar4 * 3 >> 1;
    if (local_58.allocsize * 2 < uVar4) {
      uVar5 = uVar4;
    }
    puVar3 = (uchar *)realloc(local_58.data,uVar5);
    if (puVar3 == (uchar *)0x0) goto LAB_0010dd40;
  }
  local_58.allocsize = uVar5;
  local_58.data = puVar3;
  local_58.data[sVar1] = (uchar)local_34;
  local_58.size = uVar4;
LAB_0010dd40:
  puVar3 = local_58.data;
  uVar2 = lodepng_chunk_create(&out->data,&out->size,(uint)local_58.size,"IHDR",local_58.data);
  if (uVar2 == 0) {
    out->allocsize = out->size;
  }
  local_58.size = 0;
  local_58.allocsize = 0;
  free(puVar3);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method)
{
  unsigned error = 0;
  ucvector header;
  ucvector_init(&header);

  lodepng_add32bitInt(&header, w); /*width*/
  lodepng_add32bitInt(&header, h); /*height*/
  ucvector_push_back(&header, (unsigned char)bitdepth); /*bit depth*/
  ucvector_push_back(&header, (unsigned char)colortype); /*color type*/
  ucvector_push_back(&header, 0); /*compression method*/
  ucvector_push_back(&header, 0); /*filter method*/
  ucvector_push_back(&header, interlace_method); /*interlace method*/

  error = addChunk(out, "IHDR", header.data, header.size);
  ucvector_cleanup(&header);

  return error;
}